

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

parser_error parse_mcat_include_base(parser *p)

{
  long lVar1;
  parser_error pVar2;
  long *plVar3;
  char *name;
  monster_base *pmVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  
  plVar3 = (long *)parser_priv(p);
  if (plVar3 == (long *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                  ,0xcac,"enum parser_error parse_mcat_include_base(struct parser *)");
  }
  if (*plVar3 == 0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getstr(p,"name");
    pmVar4 = lookup_monster_base(name);
    if (pmVar4 == (monster_base *)0x0) {
      pVar2 = PARSE_ERROR_INVALID_MONSTER_BASE;
    }
    else {
      lVar1 = *plVar3;
      uVar6 = *(uint *)(lVar1 + 0x24);
      if (((int)uVar6 < 0) || ((int)*(uint *)(lVar1 + 0x28) < (int)uVar6)) {
        __assert_fail("s->categories->n_inc_bases >= 0 && s->categories->n_inc_bases <= s->categories->max_inc_bases"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                      ,0xcb5,"enum parser_error parse_mcat_include_base(struct parser *)");
      }
      if (uVar6 == *(uint *)(lVar1 + 0x28)) {
        if (0x7ffffff < uVar6) {
          return PARSE_ERROR_TOO_MANY_ENTRIES;
        }
        iVar7 = 2;
        if (uVar6 != 0) {
          iVar7 = uVar6 * 2;
        }
        *(int *)(lVar1 + 0x28) = iVar7;
        pvVar5 = mem_realloc(*(void **)(lVar1 + 0x10),(ulong)(uint)(iVar7 << 3));
        lVar1 = *plVar3;
        *(void **)(lVar1 + 0x10) = pvVar5;
        uVar6 = *(uint *)(lVar1 + 0x24);
      }
      else {
        pvVar5 = *(void **)(lVar1 + 0x10);
      }
      *(monster_base **)((long)pvVar5 + (long)(int)uVar6 * 8) = pmVar4;
      *(int *)(*plVar3 + 0x24) = *(int *)(*plVar3 + 0x24) + 1;
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_mcat_include_base(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	struct monster_base *b;

	assert(s);
	if (!s->categories) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	b = lookup_monster_base(parser_getstr(p, "name"));
	if (!b) {
		return PARSE_ERROR_INVALID_MONSTER_BASE;
	}
	assert(s->categories->n_inc_bases >= 0
		&& s->categories->n_inc_bases <= s->categories->max_inc_bases);
	if (s->categories->n_inc_bases == s->categories->max_inc_bases) {
		if (s->categories->max_inc_bases > INT_MAX
				/ (2 * (int) sizeof(struct monster_base*))) {
			return PARSE_ERROR_TOO_MANY_ENTRIES;
		}
		s->categories->max_inc_bases = (s->categories->max_inc_bases)
			? 2 * s->categories->max_inc_bases : 2;
		s->categories->inc_bases = mem_realloc(
			s->categories->inc_bases,
			s->categories->max_inc_bases
			* sizeof(struct monster_base*));
	}
	s->categories->inc_bases[s->categories->n_inc_bases] = b;
	++s->categories->n_inc_bases;

	return PARSE_ERROR_NONE;
}